

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  const_iterator this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  FieldDescriptor *local_48;
  bool local_39;
  const_iterator cStack_38;
  bool has;
  _Self local_30;
  const_iterator iter;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *output_local;
  DescriptorPool *pool_local;
  Descriptor *containing_type_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)output;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::begin(&this->extensions_);
  while( true ) {
    cStack_38 = std::
                map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                ::end(&this->extensions_);
    bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    local_39 = false;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    if (((ppVar3->second).is_repeated & 1U) == 0) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      local_39 = (bool)(((ppVar3->second).field_0xa & 0xf ^ 0xff) & 1);
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      iVar2 = Extension::GetSize(&ppVar3->second);
      local_39 = 0 < iVar2;
    }
    if (local_39 != false) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      this_00 = iter;
      if ((ppVar3->second).descriptor == (FieldDescriptor *)0x0) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        local_48 = DescriptorPool::FindExtensionByNumber(pool,containing_type,ppVar3->first);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)this_00._M_node,&local_48);
      }
      else {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)this_00._M_node,&(ppVar3->second).descriptor);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* containing_type,
    const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    bool has = false;
    if (iter->second.is_repeated) {
      has = iter->second.GetSize() > 0;
    } else {
      has = !iter->second.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (iter->second.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(
            containing_type, iter->first));
      } else {
        output->push_back(iter->second.descriptor);
      }
    }
  }
}